

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::read_content<httplib::Response>(Stream *strm,Response *x,Progress *progress)

{
  Headers *headers;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *out;
  function<bool_(unsigned_long,_unsigned_long)> local_50;
  
  headers = &x->headers;
  bVar1 = has_header(headers,"Content-Length");
  if (bVar1) {
    iVar2 = get_header_value_int(headers,"Content-Length",0);
    if (iVar2 == 0) {
      pcVar4 = get_header_value(headers,"Transfer-Encoding",0,"");
      iVar3 = strcasecmp(pcVar4,"chunked");
      out = extraout_RDX;
      if (iVar3 == 0) goto LAB_0016169a;
    }
    std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_50,progress);
    bVar1 = read_content_with_length(strm,&x->body,(long)iVar2,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    return bVar1;
  }
  pcVar4 = get_header_value(headers,"Transfer-Encoding",0,"");
  iVar2 = strcasecmp(pcVar4,"chunked");
  out = extraout_RDX_00;
  if (iVar2 != 0) {
    bVar1 = read_content_without_length(strm,&x->body);
    return bVar1;
  }
LAB_0016169a:
  bVar1 = read_content_chunked((detail *)strm,(Stream *)&x->body,out);
  return bVar1;
}

Assistant:

bool read_content(Stream& strm, T& x, Progress progress = Progress())
{
    if (has_header(x.headers, "Content-Length")) {
        auto len = get_header_value_int(x.headers, "Content-Length", 0);
        if (len == 0) {
            const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", 0, "");
            if (!strcasecmp(encoding, "chunked")) {
                return read_content_chunked(strm, x.body);
            }
        }
        return read_content_with_length(strm, x.body, len, progress);
    } else {
        const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", 0, "");
        if (!strcasecmp(encoding, "chunked")) {
            return read_content_chunked(strm, x.body);
        }
        return read_content_without_length(strm, x.body);
    }
    return true;
}